

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyProcess.h
# Opt level: O2

void __thiscall MyProcess::set_input_file(MyProcess *this,string *file_name)

{
  MyHandler *this_00;
  string local_40;
  
  if (this->in != (Handler *)0x0) {
    (*this->in->_vptr_Handler[4])();
  }
  this_00 = (MyHandler *)operator_new(0x10);
  std::__cxx11::string::string((string *)&local_40,(string *)file_name);
  MyHandler::MyHandler(this_00,&local_40);
  this->in = (Handler *)this_00;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void set_input_file(std::string file_name) {
        delete in;
        in = new MyHandler(file_name);
    }